

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::CompositeInsertToCompositeConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  TypeManager *this;
  Type *type;
  Instruction *construct_00;
  Instruction *construct;
  Type *container_type;
  TypeManager *type_mgr;
  undefined1 local_58 [4];
  uint32_t container_type_id;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  values_inserted;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  values_inserted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)param_3;
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert && \"Wrong opcode.  Should be OpCompositeInsert.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x862,
                  "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar3 = opt::Instruction::NumInOperands(inst);
  if (uVar3 < 3) {
    context_local._7_1_ = false;
  }
  else {
    GetInsertedValues((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_58,inst);
    uVar3 = GetContainerTypeId(inst);
    if (uVar3 == 0) {
      context_local._7_1_ = false;
    }
    else {
      this = IRContext::get_type_mgr(context);
      type = analysis::TypeManager::GetType(this,uVar3);
      if (type == (Type *)0x0) {
        __assert_fail("container_type && \"GetContainerTypeId returned a bad id.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x86d,
                      "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                     );
      }
      bVar1 = DoInsertedValuesCoverEntireObject
                        (type,(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)local_58);
      if (bVar1) {
        construct_00 = BuildCompositeConstruct
                                 (uVar3,(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                         *)local_58,inst);
        InsertConstructedObject(inst,construct_00);
        context_local._7_1_ = true;
      }
      else {
        context_local._7_1_ = false;
      }
    }
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)local_58);
  }
  return context_local._7_1_;
}

Assistant:

bool CompositeInsertToCompositeConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert &&
         "Wrong opcode.  Should be OpCompositeInsert.");
  if (inst->NumInOperands() < 3) return false;

  std::map<uint32_t, uint32_t> values_inserted = GetInsertedValues(inst);
  uint32_t container_type_id = GetContainerTypeId(inst);
  if (container_type_id == 0) {
    return false;
  }

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* container_type = type_mgr->GetType(container_type_id);
  assert(container_type && "GetContainerTypeId returned a bad id.");
  if (!DoInsertedValuesCoverEntireObject(container_type, values_inserted)) {
    return false;
  }

  Instruction* construct =
      BuildCompositeConstruct(container_type_id, values_inserted, inst);
  InsertConstructedObject(inst, construct);
  return true;
}